

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipEntry.hpp
# Opt level: O0

string * __thiscall Zippy::Impl::ZipEntry::GetDataAsString_abi_cxx11_(ZipEntry *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  uchar *ch;
  const_iterator __end2;
  const_iterator __begin2;
  ZipEntryData *__range2;
  string *result;
  undefined7 in_stack_ffffffffffffff98;
  char in_stack_ffffffffffffff9f;
  string *this_00;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::__cxx11::string::string(in_RSI);
  local_20 = in_RSI + 0x23;
  local_28._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  while (bVar1 = __gnu_cxx::
                 operator==<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)this_00,
                            (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator*(&local_28);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this_00,in_stack_ffffffffffffff9f);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&local_28);
  }
  return in_RDI;
}

Assistant:

std::string GetDataAsString() const {

                std::string result;
                for (const auto & ch : m_EntryData)
                    result += static_cast<char>(ch); // TODO: Should this use reinterpret_cast instead?

                return result;
            }